

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::operator+[abi_cxx11_(string *__return_storage_ptr__,Catch *this,StringRef lhs,StringRef rhs)

{
  size_type sVar1;
  size_type sVar2;
  undefined1 local_30 [8];
  StringRef rhs_local;
  StringRef lhs_local;
  string *ret;
  
  rhs_local.m_start = rhs.m_start;
  local_30 = (undefined1  [8])lhs.m_size;
  rhs_local.m_size = (size_type)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = StringRef::size((StringRef *)&rhs_local.m_size);
  sVar2 = StringRef::size((StringRef *)local_30);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,sVar1 + sVar2);
  operator+=(__return_storage_ptr__,(StringRef *)&rhs_local.m_size);
  operator+=(__return_storage_ptr__,(StringRef *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string operator+(StringRef lhs, StringRef rhs) {
        std::string ret;
        ret.reserve(lhs.size() + rhs.size());
        ret += lhs;
        ret += rhs;
        return ret;
    }